

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

StructUnionTypeSyntax * __thiscall
slang::parsing::Parser::parseStructUnion(Parser *this,SyntaxKind syntaxKind)

{
  Token semi_00;
  Token openBrace_00;
  Token TVar1;
  undefined8 uVar2;
  DataTypeSyntax *type;
  SourceLocation SVar3;
  SourceLocation SVar4;
  reference ppVVar5;
  undefined4 extraout_var;
  StructUnionTypeSyntax *pSVar6;
  ulong uVar7;
  Info *pIVar8;
  size_type sVar9;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_type extraout_RDX_02;
  DiagCode code;
  Token keyword;
  Token packed;
  Token TVar10;
  span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> sVar11;
  SourceRange SVar12;
  Token tagged_00;
  Info *local_1d0;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> dims;
  TokenKind local_1b8;
  Info *local_1b0;
  Token local_1a0;
  Token local_190;
  undefined1 local_180 [8];
  Token tagged;
  int local_160;
  Token local_140;
  SyntaxKind local_130;
  size_type local_128;
  AttrList local_120;
  StructUnionMemberSyntax *local_110;
  Token openBrace;
  Token signing;
  Token local_d8;
  SyntaxKind local_c8;
  size_type local_c0;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_b8;
  Token local_a8;
  Token local_98;
  Token semi;
  SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL> buffer;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  tagged = ParserBase::consumeIf(&this->super_ParserBase,TaggedKeyword);
  local_1d0 = tagged.info;
  local_180 = tagged._0_8_;
  packed = ParserBase::consumeIf(&this->super_ParserBase,PackedKeyword);
  signing = parseSigning(this);
  pIVar8 = signing.info;
  TVar10 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  openBrace = TVar10;
  Token::Token(&local_190);
  buffer.super_SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>.cap = 5;
  local_1b0 = packed.info;
  if ((TVar10._0_4_ >> 0x10 & 1) == 0) {
    dims = (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)
           ParserBase::peek(&this->super_ParserBase);
    uVar7 = keyword._0_8_ & 0xffff;
    uVar2 = dims.data_;
    while (((short)uVar2 != 1 && (((uint)uVar2 & 0xffff) != 0xe))) {
      sVar11 = (span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>)
               parseAttributes(this);
      Token::Token(&local_1a0);
      TVar10 = ParserBase::peek(&this->super_ParserBase);
      if ((TVar10._0_4_ & 0xfffe) == 0xfa) {
        local_1a0 = ParserBase::consume(&this->super_ParserBase);
        if (local_1b0 == (Info *)0x0) {
          local_160 = (int)uVar7;
          if (local_160 != 0x13b) goto LAB_002a7145;
          SVar12 = Token::range(&local_1a0);
          code.subsystem = Parser;
          code.code = 0x82;
        }
        else {
          SVar12 = Token::range(&local_1a0);
          code.subsystem = Parser;
          code.code = 0x81;
        }
        ParserBase::addDiag(&this->super_ParserBase,code,SVar12);
      }
LAB_002a7145:
      type = parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)
                                ((uint)(local_1d0 != (Info *)0x0 && uVar7 == 0x13b) * 2));
      Token::Token(&semi);
      local_b8 = parseDeclarators(this,&semi,false,false);
      sVar9 = local_b8.size_;
      local_130 = SyntaxList;
      local_140 = (Token)ZEXT816(0x4703a8);
      local_c8 = SeparatedList;
      local_d8 = (Token)ZEXT816(0x473390);
      semi_00.info = semi.info;
      semi_00.kind = semi.kind;
      semi_00._2_1_ = semi._2_1_;
      semi_00.numFlags.raw = semi.numFlags.raw;
      semi_00.rawLen = semi.rawLen;
      local_128 = sVar11.size_;
      local_120 = (AttrList)sVar11;
      local_c0 = sVar9;
      local_110 = slang::syntax::SyntaxFactory::structUnionMember
                            (&this->factory,
                             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_140,
                             local_1a0,type,
                             (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)&local_d8,
                             semi_00);
      SmallVectorBase<slang::syntax::StructUnionMemberSyntax*>::
      emplace_back<slang::syntax::StructUnionMemberSyntax*>
                ((SmallVectorBase<slang::syntax::StructUnionMemberSyntax*> *)&buffer,&local_110);
      if (sVar9 == 0 && (type->super_ExpressionSyntax).super_SyntaxNode.kind == ImplicitType) {
        local_140 = ParserBase::peek(&this->super_ParserBase);
        SVar3 = Token::location(&local_140);
        SVar4 = Token::location((Token *)&dims);
        if (SVar3 == SVar4) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
      dims = (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)
             ParserBase::peek(&this->super_ParserBase);
      uVar2 = dims.data_;
    }
    local_190 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    if (((undefined1  [16])local_190 & (undefined1  [16])0x10000) == (undefined1  [16])0x0 &&
        buffer.super_SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>.len == 0) {
      SVar3 = Token::location(&local_190);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x350005,SVar3);
    }
  }
  else {
    SVar3 = Token::location(&openBrace);
    local_190 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
  }
  dims = parseDimensionList(this);
  src = (EVP_PKEY_CTX *)dims.size_;
  if (local_1b0 == (Info *)0x0) {
    if (src != (EVP_PKEY_CTX *)0x0) {
      ppVVar5 = nonstd::span_lite::
                span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::front(&dims)
      ;
      local_140 = slang::syntax::SyntaxNode::getFirstToken(&(*ppVVar5)->super_SyntaxNode);
      SVar3 = Token::location(&local_140);
      ppVVar5 = nonstd::span_lite::
                span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::back(&dims);
      local_d8 = slang::syntax::SyntaxNode::getLastToken(&(*ppVVar5)->super_SyntaxNode);
      SVar12 = Token::range(&local_d8);
      SVar12.endLoc = SVar12.endLoc;
      SVar12.startLoc = SVar3;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x780005,SVar12);
      src = extraout_RDX;
    }
    if (pIVar8 != (Info *)0x0) {
      SVar12 = Token::range(&signing);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x8d0005,SVar12);
      src = extraout_RDX_00;
    }
  }
  local_1b8 = keyword.kind;
  TVar10 = tagged;
  if (local_1d0 != (Info *)0x0 && local_1b8 == StructKeyword) {
    SVar12 = Token::range(&tagged);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x870005,SVar12);
    TVar10 = tagged;
    local_180._0_2_ = tagged.kind;
    local_180[2] = tagged._2_1_;
    local_180[3] = tagged.numFlags.raw;
    local_180._4_4_ = tagged.rawLen;
    local_1d0 = tagged.info;
    src = extraout_RDX_01;
  }
  TVar1 = openBrace;
  local_a8.kind = openBrace.kind;
  local_a8._2_1_ = openBrace._2_1_;
  local_a8.numFlags.raw = openBrace.numFlags.raw;
  local_a8.rawLen = openBrace.rawLen;
  local_a8.info = openBrace.info;
  openBrace = TVar1;
  tagged = TVar10;
  local_98 = signing;
  local_120.data_._0_4_ =
       SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::copy
                 (&buffer.super_SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>,
                  (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_120.data_._4_4_ = extraout_var;
  local_130 = SyntaxList;
  local_120.size_ = extraout_RDX_02;
  local_140 = (Token)ZEXT816(0x473d60);
  local_c0 = dims.size_;
  local_b8.data_ = (pointer)dims.data_;
  local_b8.size_ = dims.size_;
  local_d8 = (Token)ZEXT816(0x4702d8);
  openBrace_00.info = local_a8.info;
  openBrace_00.kind = local_a8.kind;
  openBrace_00._2_1_ = local_a8._2_1_;
  openBrace_00.numFlags.raw = local_a8.numFlags.raw;
  openBrace_00.rawLen = local_a8.rawLen;
  tagged_00.info = local_1d0;
  tagged_00.kind = local_180._0_2_;
  tagged_00._2_1_ = local_180[2];
  tagged_00.numFlags.raw = local_180[3];
  tagged_00.rawLen = local_180._4_4_;
  local_c8 = local_130;
  pSVar6 = slang::syntax::SyntaxFactory::structUnionType
                     (&this->factory,syntaxKind,keyword,tagged_00,packed,local_98,openBrace_00,
                      (SyntaxList<slang::syntax::StructUnionMemberSyntax> *)&local_140,local_190,
                      (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&local_d8);
  SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::~SmallVectorBase
            (&buffer.super_SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>);
  return pSVar6;
}

Assistant:

StructUnionTypeSyntax& Parser::parseStructUnion(SyntaxKind syntaxKind) {
    auto keyword = consume();
    auto tagged = consumeIf(TokenKind::TaggedKeyword);
    auto packed = consumeIf(TokenKind::PackedKeyword);
    auto signing = parseSigning();
    auto openBrace = expect(TokenKind::OpenBrace);

    Token closeBrace;
    SmallVector<StructUnionMemberSyntax*> buffer;

    if (openBrace.isMissing())
        closeBrace = missingToken(TokenKind::CloseBrace, openBrace.location());
    else {
        auto curr = peek();
        while (curr.kind != TokenKind::CloseBrace && curr.kind != TokenKind::EndOfFile) {
            auto attributes = parseAttributes();

            Token randomQualifier;
            switch (peek().kind) {
                case TokenKind::RandKeyword:
                case TokenKind::RandCKeyword:
                    randomQualifier = consume();
                    if (packed)
                        addDiag(diag::RandOnPackedMember, randomQualifier.range());
                    else if (keyword.kind == TokenKind::UnionKeyword)
                        addDiag(diag::RandOnUnionMember, randomQualifier.range());
                    break;
                default:
                    break;
            }

            bitmask<TypeOptions> typeOptions;
            if (tagged.valid() && keyword.kind == TokenKind::UnionKeyword)
                typeOptions = TypeOptions::AllowVoid;

            auto& type = parseDataType(typeOptions);

            Token semi;
            auto declarators = parseDeclarators(semi);

            buffer.push_back(
                &factory.structUnionMember(attributes, randomQualifier, type, declarators, semi));

            // If we failed to consume any tokens for this member, skip whatever token is
            // in the way, otherwise we will loop forever.
            if (type.kind == SyntaxKind::ImplicitType && declarators.empty() &&
                peek().location() == curr.location()) {
                skipToken({});
            }

            curr = peek();
        }
        closeBrace = expect(TokenKind::CloseBrace);

        if (buffer.empty() && !closeBrace.isMissing())
            addDiag(diag::ExpectedMember, closeBrace.location());
    }

    auto dims = parseDimensionList();
    if (!packed) {
        if (!dims.empty()) {
            SourceRange range{dims.front()->getFirstToken().location(),
                              dims.back()->getLastToken().range().end()};
            addDiag(diag::PackedDimsOnUnpacked, range);
        }

        if (signing)
            addDiag(diag::UnpackedSigned, signing.range());
    }

    if (keyword.kind == TokenKind::StructKeyword && tagged.valid())
        addDiag(diag::TaggedStruct, tagged.range());

    return factory.structUnionType(syntaxKind, keyword, tagged, packed, signing, openBrace,
                                   buffer.copy(alloc), closeBrace, dims);
}